

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_shrinkToFit_success_hasNotLeastCapacity_fn(int _i)

{
  bool bVar1;
  size_t sVar2;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_7;
  void *_ck_x_6;
  intmax_t _ck_y_4;
  intmax_t _ck_x_5;
  intmax_t _ck_y_3;
  intmax_t _ck_x_4;
  void *_ck_x_3;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  private_ACUtilsTest_ADynArray_CharArray array;
  size_t i;
  int _i_local;
  
  memcpy(&_ck_x,&PTR_private_ACUtilsTest_ADynArray_realloc_001a6d70,0x30);
  array.growStrategy = (ACUtilsGrowStrategy)0x7;
  array.size = private_ACUtilsTest_ADynArray_growStrategy(9,1);
  private_ACUtilsTest_ADynArray_reallocFail = false;
  array.capacity = (*(code *)_ck_x)(0,array.size);
  for (array.buffer = (char *)0x0; array.buffer < array.growStrategy + -1;
      array.buffer = array.buffer + 1) {
    array.buffer[array.capacity] = '5';
  }
  array.growStrategy[array.capacity - 1] = (_func_size_t_size_t_size_t)0x30;
  array.deallocator = private_ACUtilsTest_ADynArray_growStrategy;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_shrinkToFit(&_ck_x,1);
  if ((ulong)bVar1 != 1) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x18d,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "private_ACUtils_ADynArray_shrinkToFit(&array, sizeof(*(&array)->buffer)) == true"
                      ,"private_ACUtils_ADynArray_shrinkToFit(&array, sizeof(*(&array)->buffer))",
                      (ulong)bVar1,"true",1,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x18d);
  if (array.growStrategy != (ACUtilsGrowStrategy)0x7) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x18e,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "array.size == private_ACUtilsTest_ADynArray_capacityMin - 1","array.size",
                      array.growStrategy,"private_ACUtilsTest_ADynArray_capacityMin - 1",7,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x18e);
  if (array.size == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,399);
    if (array.capacity == 0) {
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,400,"Assertion \'_ck_x != NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x","(void*) array.buffer != NULL",
                        "(void*) array.buffer",0,0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,400);
    for (array.buffer = (char *)0x0; array.buffer < (char *)0x6; array.buffer = array.buffer + 1) {
      if ((long)array.buffer[array.capacity] != 0x35) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x192,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %jd, %s == %jd","array.buffer[i] == \'5\'"
                          ,"array.buffer[i]",(long)array.buffer[array.capacity],"\'5\'",0x35,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x192);
    }
    if ((long)*(char *)(array.capacity + 6) != 0x30) {
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x193,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %jd, %s == %jd",
                        "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2] == \'0\'",
                        "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2]",
                        (long)*(char *)(array.capacity + 6),"\'0\'",0x30,0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x193);
    if (array.deallocator != (ACUtilsDeallocator)0x0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x194);
      if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
        sVar2 = 0x195;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x195);
        (*array.reallocator)((void *)array.capacity,sVar2);
        return;
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x195,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                        "private_ACUtilsTest_ADynArray_reallocCount == 1",
                        "private_ACUtilsTest_ADynArray_reallocCount",
                        private_ACUtilsTest_ADynArray_reallocCount,"1",1,0);
    }
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x194,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) array.growStrategy != NULL",
                      "(void*) array.growStrategy",0,0);
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,399,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                    "array.capacity == private_ACUtilsTest_ADynArray_capacityMin","array.capacity",
                    array.size,"private_ACUtilsTest_ADynArray_capacityMin",8,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_shrinkToFit_success_hasNotLeastCapacity)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin - 1;
    array.capacity = private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char));
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_shrinkToFit(&array), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin - 1);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 2; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2], '0');
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}